

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O3

void __thiscall
fizplex::BaseTestRegularWithReordering::~BaseTestRegularWithReordering
          (BaseTestRegularWithReordering *this)

{
  pointer pNVar1;
  unsigned_long *puVar2;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BaseTestRegularWithReordering_001c0c50;
  operator_delete((this->dv2).vals._M_data);
  operator_delete((this->dv1).vals._M_data);
  operator_delete((this->dv0).vals._M_data);
  pNVar1 = (this->sv2).values.
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar1 != (pointer)0x0) {
    operator_delete(pNVar1,(long)(this->sv2).values.
                                 super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pNVar1);
  }
  pNVar1 = (this->sv1).values.
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar1 != (pointer)0x0) {
    operator_delete(pNVar1,(long)(this->sv1).values.
                                 super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pNVar1);
  }
  pNVar1 = (this->sv0).values.
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar1 != (pointer)0x0) {
    operator_delete(pNVar1,(long)(this->sv0).values.
                                 super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pNVar1);
  }
  puVar2 = (this->b).row_ordering._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  if (puVar2 != (unsigned_long *)0x0) {
    operator_delete__(puVar2);
  }
  (this->b).row_ordering._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = (unsigned_long *)0x0;
  operator_delete((this->b).work.vals._M_data);
  std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::~vector(&(this->b).etms);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&(this->m).cols);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

BaseTestRegularWithReordering() : b(m){}